

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall
SolverTest_DoubleOptionHelper_Test::~SolverTest_DoubleOptionHelper_Test
          (SolverTest_DoubleOptionHelper_Test *this)

{
  void *in_RDI;
  
  ~SolverTest_DoubleOptionHelper_Test((SolverTest_DoubleOptionHelper_Test *)0x1644f8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SolverTest, DoubleOptionHelper) {
  fmt::MemoryWriter w;
  OptionHelper<double>::Write(w, 4.2);
  EXPECT_EQ("4.2", w.str());
  const char *start = "1.23 ";
  const char *s = start;
  EXPECT_EQ(1.23, OptionHelper<double>::Parse(s));
  EXPECT_EQ(start + 4, s);
  EXPECT_EQ(4.2, OptionHelper<double>::CastArg(4.2));
}